

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O1

void __thiscall
jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::short_string_storage
::short_string_storage
          (short_string_storage *this,char_type_conflict *p,uint8_t length,semantic_tag tag)

{
  assertion_error *this_00;
  string local_38;
  
  *(byte *)this = length << 4 | 7;
  this->tag_ = tag;
  if (length < 3) {
    memcpy(this->data_,p,(ulong)length * 4);
    this->data_[length] = 0;
    return;
  }
  this_00 = (assertion_error *)__cxa_allocate_exception(0x10);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"assertion \'length <= max_length\' failed at  <> :0","");
  assertion_error::assertion_error(this_00,&local_38);
  __cxa_throw(this_00,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

short_string_storage(const char_type* p, uint8_t length, semantic_tag tag)
                : storage_kind_(static_cast<uint8_t>(json_storage_kind::short_str)), short_str_length_(length), tag_(tag)
            {
                JSONCONS_ASSERT(length <= max_length);
                std::memcpy(data_,p,length*sizeof(char_type));
                data_[length] = 0;
            }